

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall booster::log::message::message(message *this,message *other)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc8;
  
  *in_RDI = *in_RSI;
  *(undefined8 *)(in_RDI + 2) = *(undefined8 *)(in_RSI + 2);
  *(undefined8 *)(in_RDI + 4) = *(undefined8 *)(in_RSI + 4);
  in_RDI[6] = in_RSI[6];
  std::
  unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unique_ptr((unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(in_RDI + 8),in_stack_ffffffffffffffc8);
  copy_ptr<booster::log::message::data>::copy_ptr
            ((copy_ptr<booster::log::message::data> *)(in_RDI + 10));
  return;
}

Assistant:

message::message(message &&other) :
		level_(other.level_),
		module_(other.module_),
		file_name_(other.file_name_),
		file_line_(other.file_line_),
		message_(std::move(other.message_))
	{
	}